

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void Diligent::InitVariable(String *Name,String *InitValue,stringstream *OutSS)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(OutSS + 0x10),"    ",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(OutSS + 0x10),(Name->_M_dataplus)._M_p,Name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(InitValue->_M_dataplus)._M_p,InitValue->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  return;
}

Assistant:

void InitVariable(const String& Name, const String& InitValue, std::stringstream& OutSS)
{
    OutSS << "    " << Name << " = " << InitValue << ";\n";
}